

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

GLRState * __thiscall GLRParser::findState(GLRParser *this,string *stateName)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  GLRState *pGVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)stateName);
  if (iVar1 == 0) {
    pGVar4 = this->acceptState;
  }
  else {
    p_Var2 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->states)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      __s2 = (stateName->_M_dataplus)._M_p;
      __n = stateName->_M_string_length;
      do {
        pGVar4 = *(GLRState **)(p_Var2 + 1);
        if ((pGVar4->name)._M_string_length == __n) {
          if (__n == 0) {
            return pGVar4;
          }
          iVar1 = bcmp((pGVar4->name)._M_dataplus._M_p,__s2,__n);
          if (iVar1 == 0) {
            return pGVar4;
          }
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    pGVar4 = (GLRState *)0x0;
  }
  return pGVar4;
}

Assistant:

GLRState *GLRParser::findState(const std::string &stateName) {
//    return *std::find(states.begin(), states.end(), stateName);
    if (stateName == "accept") {
        return acceptState;
    }


    for (GLRState *state: states) {
        if (state->getName() == stateName) {
            return state;
        }
    }


    return nullptr;
}